

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::RecursiveMessage::Clear(RecursiveMessage *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  RecursiveMessage *pRStack_18;
  uint32_t cached_has_bits;
  RecursiveMessage *this_local;
  
  this_local = (RecursiveMessage *)&this->field_0;
  local_1c = 0;
  pRStack_18 = this;
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 3) != 0) {
    if ((local_1c & 1) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.payload_);
    }
    if ((local_1c & 2) != 0) {
      if ((this->field_0)._impl_.recurse_ == (RecursiveMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x33a9,"_impl_.recurse_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
      Clear((this->field_0)._impl_.recurse_);
    }
  }
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void RecursiveMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.RecursiveMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.payload_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.recurse_ != nullptr);
      _impl_.recurse_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}